

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

Slice * leveldb::Reverse_abi_cxx11_(Slice *key)

{
  bool bVar1;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58 [8];
  reverse_iterator rit;
  allocator local_3a;
  undefined1 local_39;
  undefined1 local_38 [8];
  string str;
  Slice *key_local;
  string *rev;
  
  Slice::ToString_abi_cxx11_((Slice *)local_38);
  local_39 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)key,"",&local_3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  std::__cxx11::string::rbegin();
  while( true ) {
    std::__cxx11::string::rend();
    bVar1 = std::operator!=(local_58,local_60);
    if (!bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator*(local_58);
    std::__cxx11::string::push_back((char)key);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(local_58);
  }
  local_39 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return key;
}

Assistant:

static std::string Reverse(const Slice& key) {
  std::string str(key.ToString());
  std::string rev("");
  for (std::string::reverse_iterator rit = str.rbegin(); rit != str.rend();
       ++rit) {
    rev.push_back(*rit);
  }
  return rev;
}